

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::applyCommandLine(Context *this,int argc,char **argv)

{
  String local_30;
  
  parseArgs(this,argc,argv,false);
  if (argc != 0) {
    String::String(&local_30,*argv);
    String::operator=(&(this->p->super_ContextOptions).binary_name,&local_30);
    String::~String(&local_30);
  }
  return;
}

Assistant:

void Context::applyCommandLine(int argc, const char* const* argv) {
    parseArgs(argc, argv);
    if(argc)
        p->binary_name = argv[0];
}